

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_acceptor.h
# Opt level: O3

void __thiscall
cppcms::impl::cgi::
socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
::socket_acceptor(socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
                  *this,service *srv,string *path,int backlog)

{
  acceptor *this_00;
  io_service *piVar1;
  endpoint ep;
  endpoint aeStack_28 [8];
  
  (this->super_acceptor)._vptr_acceptor = (_func_int **)&PTR_async_accept_0028aac8;
  this->srv_ = srv;
  (this->api_).super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->api_).super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  piVar1 = cppcms::service::get_io_service(srv);
  this_00 = &this->acceptor_;
  booster::aio::acceptor::acceptor(this_00,piVar1);
  this->stopped_ = false;
  this->tcp_ = false;
  booster::aio::endpoint::endpoint(aeStack_28,(string *)path);
  booster::aio::acceptor::open(this_00,0);
  booster::aio::basic_socket::set_option(this_00,2,1);
  unlink((path->_M_dataplus)._M_p);
  booster::aio::acceptor::bind((endpoint *)this_00);
  booster::aio::acceptor::listen((int)this_00);
  booster::aio::endpoint::~endpoint(aeStack_28);
  return;
}

Assistant:

socket_acceptor(cppcms::service &srv,std::string path,int backlog) :
				srv_(srv),
				acceptor_(srv_.get_io_service()),
				stopped_(false),
				tcp_(false)
			{
				io::endpoint ep(path);
				acceptor_.open(io::pf_unix);
				acceptor_.set_option(io::basic_socket::reuse_address,true);
				::unlink(path.c_str());
				acceptor_.bind(ep);
				acceptor_.listen(backlog);
			}